

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::analysis::DebugInfoManager::GetVulkanDebugOperation
          (DebugInfoManager *this,Instruction *inst)

{
  NonSemanticShaderDebugInfo100Instructions_conflict NVar1;
  uint32_t uVar2;
  ConstantManager *this_00;
  DefUseManager *this_01;
  Instruction *inst_00;
  Constant *this_02;
  
  NVar1 = Instruction::GetShader100DebugOpcode(inst);
  if (NVar1 == NonSemanticShaderDebugInfo100DebugOperation) {
    this_00 = IRContext::get_constant_mgr(this->context_);
    this_01 = IRContext::get_def_use_mgr(this->context_);
    uVar2 = Instruction::GetSingleWordOperand(inst,4);
    inst_00 = DefUseManager::GetDef(this_01,uVar2);
    this_02 = ConstantManager::GetConstantFromInst(this_00,inst_00);
    uVar2 = Constant::GetU32(this_02);
    return uVar2;
  }
  __assert_fail("inst->GetShader100DebugOpcode() == NonSemanticShaderDebugInfo100DebugOperation && \"inst must be Vulkan DebugOperation\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                ,0x265,
                "uint32_t spvtools::opt::analysis::DebugInfoManager::GetVulkanDebugOperation(Instruction *)"
               );
}

Assistant:

uint32_t DebugInfoManager::GetVulkanDebugOperation(Instruction* inst) {
  assert(inst->GetShader100DebugOpcode() ==
             NonSemanticShaderDebugInfo100DebugOperation &&
         "inst must be Vulkan DebugOperation");
  return context()
      ->get_constant_mgr()
      ->GetConstantFromInst(context()->get_def_use_mgr()->GetDef(
          inst->GetSingleWordOperand(kDebugOperationOperandOperationIndex)))
      ->GetU32();
}